

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_base.cpp
# Opt level: O0

void __thiscall ximu::WriterBase::sendWriteDateTimePacket(WriterBase *this,DateTimeData *d)

{
  pointer data;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> dest;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  DateTimeData *d_local;
  WriterBase *this_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)d;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  data = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  dest = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  PacketConstruction::
  constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((DateTimeData *)data,dest);
  (**this->_vptr_WriterBase)(this,local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void WriterBase::sendWriteDateTimePacket(DateTimeData& d) {
  std::vector<unsigned char> buffer;
  PacketConstruction::constructWriteDateTimePacket(
      d, back_inserter(buffer));
  sendSerialBuffer(buffer);
}